

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O1

void Amap_LibFree(Amap_Lib_t *p)

{
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *__ptr;
  long lVar3;
  
  if (p != (Amap_Lib_t *)0x0) {
    pVVar1 = p->vSelect;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar1 = p->vSorted;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar1 = p->vGates;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar1 = p->vRules;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (0 < pVVar1->nSize) {
        lVar3 = 0;
        do {
          pvVar2 = pVVar1->pArray[lVar3];
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
              *(undefined8 *)((long)pvVar2 + 8) = 0;
            }
            free(pvVar2);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar1->nSize);
      }
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar1 = p->vRulesX;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (0 < pVVar1->nSize) {
        lVar3 = 0;
        do {
          pvVar2 = pVVar1->pArray[lVar3];
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
              *(undefined8 *)((long)pvVar2 + 8) = 0;
            }
            free(pvVar2);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar1->nSize);
      }
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    __ptr = p->vRules3;
    if (__ptr != (Vec_Int_t *)0x0) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
    }
    Aig_MmFlexStop(p->pMemGates,0);
    Aig_MmFlexStop(p->pMemSet,0);
    if (p->pRules != (int **)0x0) {
      free(p->pRules);
      p->pRules = (int **)0x0;
    }
    if (p->pRulesX != (int **)0x0) {
      free(p->pRulesX);
      p->pRulesX = (int **)0x0;
    }
    if (p->pNodes != (Amap_Nod_t *)0x0) {
      free(p->pNodes);
      p->pNodes = (Amap_Nod_t *)0x0;
    }
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void Amap_LibFree( Amap_Lib_t * p )
{
    if ( p == NULL )
        return;
    if ( p->vSelect )
        Vec_PtrFree( p->vSelect );
    if ( p->vSorted )
        Vec_PtrFree( p->vSorted );
    if ( p->vGates )
        Vec_PtrFree( p->vGates );
    if ( p->vRules )
        Vec_VecFree( (Vec_Vec_t *)p->vRules );
    if ( p->vRulesX )
        Vec_VecFree( (Vec_Vec_t *)p->vRulesX );
    if ( p->vRules3 )
        Vec_IntFree( p->vRules3 );
    Aig_MmFlexStop( p->pMemGates, 0 );
    Aig_MmFlexStop( p->pMemSet, 0 );
    ABC_FREE( p->pRules );
    ABC_FREE( p->pRulesX );
    ABC_FREE( p->pNodes );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}